

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

Node * __thiscall
anon_unknown.dwarf_146826::BuildFileImpl::getOrCreateNode
          (BuildFileImpl *this,StringRef name,bool isImplicit)

{
  node_set *this_00;
  long *plVar1;
  Node *pNVar2;
  int iVar3;
  Node *pNVar4;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_bool>
  pVar5;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_> node;
  Node *local_30;
  
  this_00 = &this->nodes;
  iVar3 = llvm::StringMapImpl::FindKey(&this_00->super_StringMapImpl,name);
  if ((iVar3 == -1) || ((long)iVar3 == (ulong)(this->nodes).super_StringMapImpl.NumBuckets)) {
    (*this->delegate->_vptr_BuildFileDelegate[0xc])
              (&local_30,this->delegate,name.Data,name.Length,(ulong)isImplicit);
    pNVar4 = local_30;
    if (local_30 == (Node *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildFile.cpp"
                    ,0x174,
                    "Node *(anonymous namespace)::BuildFileImpl::getOrCreateNode(StringRef, bool)");
    }
    pVar5 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
            ::try_emplace<>(this_00,name);
    pNVar2 = local_30;
    local_30 = (Node *)0x0;
    plVar1 = *(long **)(*(long *)pVar5.first.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                                 .Ptr.
                                 super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                       + 8);
    *(Node **)(*(long *)pVar5.first.
                        super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
                        .Ptr.
                        super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
              + 8) = pNVar2;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if (local_30 != (Node *)0x0) {
      (*local_30->_vptr_Node[1])();
    }
  }
  else {
    pNVar4 = (Node *)(this_00->super_StringMapImpl).TheTable[iVar3][1].StrLen;
  }
  return pNVar4;
}

Assistant:

Node* getOrCreateNode(StringRef name, bool isImplicit) {
    // First, check the map.
    auto it = nodes.find(name);
    if (it != nodes.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the node.
    auto node = delegate.createNode(name, isImplicit);
    assert(node);
    auto result = node.get();
    nodes[name] = std::move(node);

    return result;
  }